

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

VectorXi __thiscall ear::ngonVertexOrder(ear *this,MatrixXd *vertices)

{
  ResScalar RVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ulong uVar5;
  ear *peVar6;
  Index extraout_RDX;
  variable_if_dynamic<long,__1> vVar7;
  int i;
  long i_00;
  double dVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  VectorXi VVar9;
  Vector3d vertex;
  double local_178;
  undefined8 uStack_170;
  binary_evaluator<Eigen::CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  local_168;
  ear *local_128;
  Vector3d a;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>
  verticesRelCentre;
  Vector3d b;
  undefined1 local_b8 [8];
  XprType local_b0;
  XprType local_80;
  Vector3d centre;
  
  local_168.m_d._0_8_ = vertices;
  local_128 = this;
  Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::mean
            ((MeanReturnType *)local_b8,
             (VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)&local_168);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&centre,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_b8);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&verticesRelCentre,
             vertices,0);
  local_168.m_d.rhsImpl.
  super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  .
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
       verticesRelCentre._32_8_;
  local_168.m_d.lhsImpl.
  super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  .
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)verticesRelCentre.m_rhs.m_rowFactor.m_value;
  local_168.m_d._0_8_ = verticesRelCentre.m_lhs;
  local_168.m_d.lhsImpl.
  super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  .
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
       verticesRelCentre.m_rhs.m_matrix.m_matrix;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>>
  ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               *)local_b8,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>>
               *)&local_168,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&centre);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&a,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                 *)local_b8);
  uStack_170 = local_178;
  local_178 = 1.79769313486232e+308;
  for (i_00 = 1;
      i_00 < (vertices->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows; i_00 = i_00 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&verticesRelCentre,
               vertices,i_00);
    local_168.m_d.rhsImpl.
    super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
    .
    super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
         verticesRelCentre._32_8_;
    local_168.m_d.lhsImpl.
    super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
    .
    super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)verticesRelCentre.m_rhs.m_rowFactor.m_value;
    local_168.m_d._0_8_ = verticesRelCentre.m_lhs;
    local_168.m_d.lhsImpl.
    super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
    .
    super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
         verticesRelCentre.m_rhs.m_matrix.m_matrix;
    Eigen::
    MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>>::
    operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               *)local_b8,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>>
               *)&local_168,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&centre);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&vertex,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_b8);
    RVar1 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&vertex,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&a);
    dVar4 = ABS(RVar1);
    uVar5 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
    if (dVar4 < local_178) {
      auVar3._8_4_ = (int)uVar5;
      auVar3._0_8_ = dVar4;
      auVar3._12_4_ = (int)(uVar5 >> 0x20);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>(&b,&vertex);
      uStack_170 = auVar3._8_8_;
      local_178 = dVar4;
    }
  }
  local_168.m_d._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&centre;
  local_b8 = (undefined1  [8])vertices;
  Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator-
            (&verticesRelCentre,(VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)local_b8,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_168);
  local_b0.m_lhs.m_lhs = verticesRelCentre.m_lhs;
  local_b0.m_lhs.m_rhs.m_matrix =
       (MatrixTypeNested)(MatrixTypeNested)verticesRelCentre.m_rhs.m_matrix.m_matrix;
  local_80.m_lhs.m_lhs = verticesRelCentre.m_lhs;
  local_80.m_lhs.m_rhs.m_matrix =
       (MatrixTypeNested)(MatrixTypeNested)verticesRelCentre.m_rhs.m_matrix.m_matrix;
  local_b0.m_lhs.m_rhs.m_rowFactor.m_value = verticesRelCentre.m_rhs.m_rowFactor.m_value;
  local_b0.m_lhs.m_rhs._16_1_ = verticesRelCentre.m_rhs._16_1_;
  local_b0.m_rhs = &a;
  local_80.m_lhs.m_rhs.m_rowFactor.m_value = verticesRelCentre.m_rhs.m_rowFactor.m_value;
  local_80.m_lhs.m_rhs._16_1_ = verticesRelCentre.m_rhs._16_1_;
  local_80.m_rhs = &b;
  vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vertex,
             verticesRelCentre.m_rhs.m_rowFactor.m_value,1);
  Eigen::internal::
  product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       *)&local_168.m_d.lhsImpl,&local_b0);
  Eigen::internal::
  product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       *)&local_168.m_d.rhsImpl,&local_80);
  vVar7.m_value = local_80.m_lhs.m_rhs.m_rowFactor.m_value;
  if (vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      != (double)local_80.m_lhs.m_rhs.m_rowFactor.m_value) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vertex,
               local_80.m_lhs.m_rhs.m_rowFactor.m_value,1);
    if (vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] != (double)vVar7.m_value) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<(lambda at /workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/src/common/geom.cpp:67:25), const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double, 3, 1>>, -1, 1>>, Eigen::Matrix<double, 3, 1>>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double, 3, 1>>, -1, 1>>, Eigen::Matrix<double, 3, 1>>>, T1 = double, T2 = double]"
                   );
    }
  }
  dVar4 = vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0];
  dVar8 = 0.0;
  if (vVar7.m_value < 1) {
    vVar7.m_value = (long)dVar8;
  }
  for (; (double)vVar7.m_value != dVar8; dVar8 = (double)((long)dVar8 + 1)) {
    dVar2 = atan2(*(double *)
                   ((long)local_168.m_d.lhsImpl.
                          super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                          .
                          super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          .m_d.data + dVar8 * 8),
                  *(double *)
                   ((long)local_168.m_d.rhsImpl.
                          super_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                          .
                          super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          .m_d.data + dVar8 * 8));
    *(double *)((long)dVar4 + (long)dVar8 * 8) = dVar2;
  }
  Eigen::internal::
  binary_evaluator<Eigen::CwiseBinaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/src/common/geom.cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  ::~binary_evaluator(&local_168);
  peVar6 = local_128;
  argSort(local_128,(VectorXd *)&vertex);
  free((void *)vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0]);
  VVar9.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  VVar9.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)peVar6
  ;
  return (VectorXi)VVar9.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXi ngonVertexOrder(Eigen::MatrixXd vertices) {
    Eigen::Vector3d centre = vertices.colwise().mean();

    // Pick two vertices to form a plane (with the third point being the
    // origin); the vertices are ordered by the angles of points projected onto
    // this plane. The first is picked arbitrarily, the second is picked to
    // minimise the colinearity with the first.
    Eigen::Vector3d a;
    Eigen::Vector3d b;
    a = vertices.row(0).transpose() - centre;
    double min = std::numeric_limits<double>::max();
    for (int i = 1; i < vertices.rows(); ++i) {
      Eigen::Vector3d vertex = vertices.row(i).transpose() - centre;
      double angle = std::abs(vertex.dot(a));
      if (angle < min) {
        min = angle;
        b = vertex;
      }
    }
    // These vectors are neither normalised or orthogonal, so the projection
    // onto them produces a linear transformation from the projection onto the
    // plane (relative to the origin); this is fine, as affine transformations
    // preserve straight lines.

    // find the angle of the projection of each vertex onto the plane
    auto verticesRelCentre = vertices.rowwise() - centre.transpose();
    auto vertexAngles =
        (verticesRelCentre * a)
            .binaryExpr(verticesRelCentre * b,
                        [](double a, double b) { return std::atan2(a, b); });
    return argSort(vertexAngles);
  }